

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O3

void __thiscall gui::Signal<gui::Widget_*>::emit(Signal<gui::Widget_*> *this,Widget *funcArgs)

{
  Widget *in_RAX;
  _Rb_tree_node_base *p_Var1;
  Widget *local_28;
  
  if (this->enabled_ == true) {
    local_28 = in_RAX;
    for (p_Var1 = (this->callbacks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->callbacks_)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      if (*(int *)&p_Var1[2]._M_parent == 0) {
        local_28 = funcArgs;
        if (p_Var1[1]._M_right == (_Base_ptr)0x0) goto LAB_00131c4f;
        (**(code **)(p_Var1 + 2))(&p_Var1[1]._M_parent,&local_28);
      }
      else {
        if (p_Var1[1]._M_right == (_Base_ptr)0x0) {
LAB_00131c4f:
          std::__throw_bad_function_call();
        }
        (**(code **)(p_Var1 + 2))();
      }
    }
  }
  return;
}

Assistant:

void emit(Targs... funcArgs) const {
        if (!enabled_) {
            return;
        }
        using Tag = typename Callback<Targs...>::Tag;
        for (const auto& c : callbacks_) {
            if (c.second.getTag() == Tag::withArgs) {
                c.second.template value<Tag::withArgs>()(funcArgs...);
            } else {
                c.second.template value<Tag::noArgs>()();
            }
        }
    }